

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O1

PixelFormat deqp::egl::getPixelFormat(Library *egl,EGLDisplay display,EGLConfig config)

{
  PixelFormat PVar1;
  PixelFormat pixelFmt;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  (*egl->_vptr_Library[0x19])();
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3023,(long)&local_38 + 4);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3022,&uStack_30);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3021,(long)&uStack_30 + 4);
  PVar1.blueBits = (undefined4)uStack_30;
  PVar1.alphaBits = uStack_30._4_4_;
  PVar1.redBits = (undefined4)local_38;
  PVar1.greenBits = local_38._4_4_;
  return PVar1;
}

Assistant:

static tcu::PixelFormat getPixelFormat (const Library& egl, EGLDisplay display, EGLConfig config)
{
	tcu::PixelFormat pixelFmt;

	egl.getConfigAttrib(display, config, EGL_RED_SIZE,		&pixelFmt.redBits);
	egl.getConfigAttrib(display, config, EGL_GREEN_SIZE,	&pixelFmt.greenBits);
	egl.getConfigAttrib(display, config, EGL_BLUE_SIZE,		&pixelFmt.blueBits);
	egl.getConfigAttrib(display, config, EGL_ALPHA_SIZE,	&pixelFmt.alphaBits);

	return pixelFmt;
}